

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FontSpecsOf.hpp
# Opt level: O3

string * __thiscall
sciplot::FontSpecsOf<sciplot::AxisLabelSpecs>::repr_abi_cxx11_
          (string *__return_storage_ptr__,FontSpecsOf<sciplot::AxisLabelSpecs> *this)

{
  ostream *poVar1;
  stringstream ss;
  stringstream local_1a0 [16];
  ostream local_190 [112];
  ios_base local_120 [264];
  
  std::__cxx11::stringstream::stringstream(local_1a0);
  if ((this->m_fontsize)._M_string_length != 0 || (this->m_fontname)._M_string_length != 0) {
    std::__ostream_insert<char,std::char_traits<char>>(local_190,"font \'",6);
    poVar1 = std::__ostream_insert<char,std::char_traits<char>>
                       (local_190,(this->m_fontname)._M_dataplus._M_p,
                        (this->m_fontname)._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar1,",",1);
    poVar1 = std::__ostream_insert<char,std::char_traits<char>>
                       (poVar1,(this->m_fontsize)._M_dataplus._M_p,
                        (this->m_fontsize)._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar1,"\'",1);
  }
  std::__cxx11::stringbuf::str();
  std::__cxx11::stringstream::~stringstream(local_1a0);
  std::ios_base::~ios_base(local_120);
  return __return_storage_ptr__;
}

Assistant:

auto FontSpecsOf<DerivedSpecs>::repr() const -> std::string
{
    std::stringstream ss;
    if(m_fontname.size() || m_fontsize.size())
        ss << "font '" << m_fontname << "," << m_fontsize << "'";
    return ss.str();
}